

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

TypeCast * __thiscall soul::heart::Parser::parseCast(Parser *this,FunctionParseState *state)

{
  Module *pMVar1;
  Expression *args_1;
  TypeCast *pTVar2;
  CodeLocation pos;
  Type destType;
  CodeLocation local_40;
  Type local_30;
  
  local_40.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_40.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_40.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_40.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_40.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  readValueType(&local_30,this);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x27f6d5);
  args_1 = parseExpression(this,state);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x27d2c7);
  pMVar1 = (this->module).object;
  if (pMVar1 != (Module *)0x0) {
    pTVar2 = PoolAllocator::
             allocate<soul::heart::TypeCast,soul::CodeLocation&,soul::heart::Expression&,soul::Type&>
                       (&pMVar1->allocator->pool,&local_40,args_1,&local_30);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_40.sourceCode.object);
    return pTVar2;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

heart::TypeCast& parseCast (const FunctionParseState& state)
    {
        auto pos = location;
        auto destType = readValueType();
        expect (HEARTOperator::openParen);
        auto& source = parseExpression (state);
        expect (HEARTOperator::closeParen);

        return module->allocate<heart::TypeCast> (pos, source, destType);
    }